

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFormatTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::TextureFormatTests::init(TextureFormatTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 format_00;
  TestContext *pTVar1;
  Context *pCVar2;
  TestNode *node;
  TestNode *node_00;
  TestNode *node_01;
  TestNode *node_02;
  char *pcVar3;
  TextureCubeArrayFormatCase *pTVar4;
  RenderContext *pRVar5;
  ContextInfo *pCVar6;
  char *pcVar7;
  void *pvVar8;
  TextureBufferFormatCase *pTVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_998;
  undefined1 local_971;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_970;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_950;
  allocator<char> local_929;
  undefined1 local_928 [8];
  string descriptionBase_3;
  undefined1 local_900 [8];
  string nameBase_3;
  deUint32 internalFormat_2;
  int formatNdx_3;
  anon_struct_16_2_e82303c2 bufferColorFormats [27];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  undefined1 local_6d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  allocator<char> local_691;
  undefined1 local_690 [8];
  string descriptionBase_2;
  undefined1 local_668 [8];
  string nameBase_2;
  int local_640;
  deUint32 internalFormat_1;
  int formatNdx_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  undefined1 local_5f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  allocator<char> local_5a9;
  undefined1 local_5a8 [8];
  string descriptionBase_1;
  undefined1 local_580 [8];
  string nameBase_1;
  deUint32 internalFormat;
  int formatNdx_1;
  anon_struct_16_2_e82303c2 sizedDepthStencilFormats [5];
  anon_struct_16_2_e82303c2 sizedColorFormats [49];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 local_1a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  allocator<char> local_161;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_120 [8];
  string descriptionBase;
  undefined1 local_f8 [8];
  string nameBase;
  deUint32 dataType;
  deUint32 format;
  int formatNdx;
  anon_struct_16_3_5cb0d78b texFormats [8];
  TestCaseGroup *sizedCubeArrayGroup;
  TestCaseGroup *sizedBufferGroup;
  TestCaseGroup *sizedGroup;
  TestCaseGroup *unsizedGroup;
  TextureFormatTests *this_local;
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"unsized",
             "Unsized formats");
  tcu::TestNode::addChild((TestNode *)this,node);
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"sized",
             "Sized formats");
  tcu::TestNode::addChild((TestNode *)this,node_00);
  node_01 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_01,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"buffer",
             "Sized formats (Buffer)");
  tcu::TestNode::addChild((TestNode *)this,node_01);
  node_02 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_02,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube_array",
             "Sized formats (2D Array)");
  tcu::TestNode::addChild(node_00,node_02);
  memcpy(&format,&DAT_032b4810,0x80);
  for (dataType = 0; (int)dataType < 8; dataType = dataType + 1) {
    format_00 = *(deUint32 *)&texFormats[(int)dataType].name;
    nameBase.field_2._12_4_ = *(undefined4 *)((long)&texFormats[(int)dataType].name + 4);
    pcVar3 = *(char **)(&format + (long)(int)dataType * 4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f8,pcVar3,
               (allocator<char> *)(descriptionBase.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator
              ((allocator<char> *)(descriptionBase.field_2._M_local_buf + 0xf));
    pcVar3 = glu::getTextureFormatName(format_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,pcVar3,&local_161);
    std::operator+(&local_140,&local_160,", ");
    pcVar3 = glu::getTypeName(nameBase.field_2._12_4_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                   &local_140,pcVar3);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator(&local_161);
    pTVar4 = (TextureCubeArrayFormatCase *)operator_new(0xf8);
    local_1a9 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar5 = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    pCVar6 = gles31::Context::getContextInfo((this->super_TestCaseGroup).m_context);
    std::operator+(&local_188,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   "_cube_array_pot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_1a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                   ", GL_TEXTURE_CUBE_MAP_ARRAY");
    pcVar7 = (char *)std::__cxx11::string::c_str();
    TextureCubeArrayFormatCase::TextureCubeArrayFormatCase
              (pTVar4,pTVar1,pRVar5,pCVar6,pcVar3,pcVar7,format_00,nameBase.field_2._12_4_,0x40,0xc)
    ;
    local_1a9 = 0;
    tcu::TestNode::addChild(node,(TestNode *)pTVar4);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_188);
    pTVar4 = (TextureCubeArrayFormatCase *)operator_new(0xf8);
    sizedColorFormats[0x30]._15_1_ = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar5 = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    pCVar6 = gles31::Context::getContextInfo((this->super_TestCaseGroup).m_context);
    std::operator+(&local_1d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   "_cube_array_npot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_1f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                   ", GL_TEXTURE_CUBE_MAP_ARRAY");
    pcVar7 = (char *)std::__cxx11::string::c_str();
    TextureCubeArrayFormatCase::TextureCubeArrayFormatCase
              (pTVar4,pTVar1,pRVar5,pCVar6,pcVar3,pcVar7,format_00,nameBase.field_2._12_4_,0x40,0xc)
    ;
    sizedColorFormats[0x30]._15_1_ = 0;
    tcu::TestNode::addChild(node,(TestNode *)pTVar4);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)local_120);
    std::__cxx11::string::~string((string *)local_f8);
  }
  memcpy(&sizedDepthStencilFormats[4].internalFormat,&PTR_anon_var_dwarf_2496f8_032b4890,0x310);
  memcpy(&internalFormat,&PTR_anon_var_dwarf_12b5806_032b4ba0,0x50);
  for (nameBase_1.field_2._12_4_ = 0; (int)nameBase_1.field_2._12_4_ < 0x31;
      nameBase_1.field_2._12_4_ = nameBase_1.field_2._12_4_ + 1) {
    nameBase_1.field_2._8_4_ =
         *(undefined4 *)&sizedColorFormats[(int)nameBase_1.field_2._12_4_].name;
    pcVar3 = *(char **)&sizedDepthStencilFormats[(long)(int)nameBase_1.field_2._12_4_ + 4].
                        internalFormat;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_580,pcVar3,
               (allocator<char> *)(descriptionBase_1.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator
              ((allocator<char> *)(descriptionBase_1.field_2._M_local_buf + 0xf));
    pcVar3 = glu::getTextureFormatName(nameBase_1.field_2._8_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_5a8,pcVar3,&local_5a9);
    std::allocator<char>::~allocator(&local_5a9);
    pTVar4 = (TextureCubeArrayFormatCase *)operator_new(0xf8);
    local_5f1 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar5 = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    pCVar6 = gles31::Context::getContextInfo((this->super_TestCaseGroup).m_context);
    std::operator+(&local_5d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_580,
                   "_pot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_5f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8,
                   ", GL_TEXTURE_CUBE_MAP_ARRAY");
    pcVar7 = (char *)std::__cxx11::string::c_str();
    TextureCubeArrayFormatCase::TextureCubeArrayFormatCase
              (pTVar4,pTVar1,pRVar5,pCVar6,pcVar3,pcVar7,nameBase_1.field_2._8_4_,0x40,0xc);
    local_5f1 = 0;
    tcu::TestNode::addChild(node_02,(TestNode *)pTVar4);
    std::__cxx11::string::~string((string *)&local_5f0);
    std::__cxx11::string::~string((string *)&local_5d0);
    pTVar4 = (TextureCubeArrayFormatCase *)operator_new(0xf8);
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar5 = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    pCVar6 = gles31::Context::getContextInfo((this->super_TestCaseGroup).m_context);
    std::operator+(&local_618,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_580,
                   "_npot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&formatNdx_2
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a8,
                   ", GL_TEXTURE_CUBE_MAP_ARRAY");
    pcVar7 = (char *)std::__cxx11::string::c_str();
    TextureCubeArrayFormatCase::TextureCubeArrayFormatCase
              (pTVar4,pTVar1,pRVar5,pCVar6,pcVar3,pcVar7,nameBase_1.field_2._8_4_,0x40,0xc);
    tcu::TestNode::addChild(node_02,(TestNode *)pTVar4);
    std::__cxx11::string::~string((string *)&formatNdx_2);
    std::__cxx11::string::~string((string *)&local_618);
    std::__cxx11::string::~string((string *)local_5a8);
    std::__cxx11::string::~string((string *)local_580);
  }
  for (local_640 = 0; local_640 < 5; local_640 = local_640 + 1) {
    nameBase_2.field_2._12_4_ = *(undefined4 *)&sizedDepthStencilFormats[local_640].name;
    pcVar3 = *(char **)(&internalFormat + (long)local_640 * 4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_668,pcVar3,
               (allocator<char> *)(descriptionBase_2.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator
              ((allocator<char> *)(descriptionBase_2.field_2._M_local_buf + 0xf));
    pcVar3 = glu::getTextureFormatName(nameBase_2.field_2._12_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_690,pcVar3,&local_691);
    std::allocator<char>::~allocator(&local_691);
    pTVar4 = (TextureCubeArrayFormatCase *)operator_new(0xf8);
    local_6d9 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar5 = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    pCVar6 = gles31::Context::getContextInfo((this->super_TestCaseGroup).m_context);
    std::operator+(&local_6b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_668,
                   "_pot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_6d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_690,
                   ", GL_TEXTURE_CUBE_MAP_ARRAY");
    pcVar7 = (char *)std::__cxx11::string::c_str();
    TextureCubeArrayFormatCase::TextureCubeArrayFormatCase
              (pTVar4,pTVar1,pRVar5,pCVar6,pcVar3,pcVar7,nameBase_2.field_2._12_4_,0x40,0xc);
    local_6d9 = 0;
    tcu::TestNode::addChild(node_02,(TestNode *)pTVar4);
    std::__cxx11::string::~string((string *)&local_6d8);
    std::__cxx11::string::~string((string *)&local_6b8);
    pTVar4 = (TextureCubeArrayFormatCase *)operator_new(0xf8);
    bufferColorFormats[0x1a]._15_1_ = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar5 = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    pCVar6 = gles31::Context::getContextInfo((this->super_TestCaseGroup).m_context);
    std::operator+(&local_700,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_668,
                   "_npot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_720,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_690,
                   ", GL_TEXTURE_CUBE_MAP_ARRAY");
    pcVar7 = (char *)std::__cxx11::string::c_str();
    TextureCubeArrayFormatCase::TextureCubeArrayFormatCase
              (pTVar4,pTVar1,pRVar5,pCVar6,pcVar3,pcVar7,nameBase_2.field_2._12_4_,0x40,0xc);
    bufferColorFormats[0x1a]._15_1_ = 0;
    tcu::TestNode::addChild(node_02,(TestNode *)pTVar4);
    std::__cxx11::string::~string((string *)&local_720);
    std::__cxx11::string::~string((string *)&local_700);
    std::__cxx11::string::~string((string *)local_690);
    std::__cxx11::string::~string((string *)local_668);
  }
  pvVar8 = memcpy(&internalFormat_2,&DAT_032b4bf0,0x1b0);
  nameBase_3.field_2._12_4_ = 0;
  while ((int)nameBase_3.field_2._12_4_ < 0x1b) {
    nameBase_3.field_2._8_4_ =
         *(undefined4 *)&bufferColorFormats[(int)nameBase_3.field_2._12_4_].name;
    pcVar3 = *(char **)(&internalFormat_2 + (long)(int)nameBase_3.field_2._12_4_ * 4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_900,pcVar3,
               (allocator<char> *)(descriptionBase_3.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator
              ((allocator<char> *)(descriptionBase_3.field_2._M_local_buf + 0xf));
    pcVar3 = glu::getTextureFormatName(nameBase_3.field_2._8_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_928,pcVar3,&local_929);
    std::allocator<char>::~allocator(&local_929);
    pTVar9 = (TextureBufferFormatCase *)operator_new(0xf0);
    local_971 = 1;
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pRVar5 = gles31::Context::getRenderContext(pCVar2);
    std::operator+(&local_950,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_900,
                   "_pot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_970,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_928,
                   ", GL_TEXTURE_BUFFER");
    pcVar7 = (char *)std::__cxx11::string::c_str();
    TextureBufferFormatCase::TextureBufferFormatCase
              (pTVar9,pCVar2,pRVar5,pcVar3,pcVar7,nameBase_3.field_2._8_4_,0x40);
    local_971 = 0;
    tcu::TestNode::addChild(node_01,(TestNode *)pTVar9);
    std::__cxx11::string::~string((string *)&local_970);
    std::__cxx11::string::~string((string *)&local_950);
    pTVar9 = (TextureBufferFormatCase *)operator_new(0xf0);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pRVar5 = gles31::Context::getRenderContext(pCVar2);
    std::operator+(&local_998,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_900,
                   "_npot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_9b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_928,
                   ", GL_TEXTURE_BUFFER");
    pcVar7 = (char *)std::__cxx11::string::c_str();
    TextureBufferFormatCase::TextureBufferFormatCase
              (pTVar9,pCVar2,pRVar5,pcVar3,pcVar7,nameBase_3.field_2._8_4_,0x70);
    tcu::TestNode::addChild(node_01,(TestNode *)pTVar9);
    std::__cxx11::string::~string((string *)&local_9b8);
    std::__cxx11::string::~string((string *)&local_998);
    std::__cxx11::string::~string((string *)local_928);
    std::__cxx11::string::~string((string *)local_900);
    nameBase_3.field_2._12_4_ = nameBase_3.field_2._12_4_ + 1;
    pvVar8 = (void *)(ulong)(uint)nameBase_3.field_2._12_4_;
  }
  return (int)pvVar8;
}

Assistant:

void TextureFormatTests::init (void)
{
	tcu::TestCaseGroup* unsizedGroup	= DE_NULL;
	tcu::TestCaseGroup*	sizedGroup		= DE_NULL;
	tcu::TestCaseGroup*	sizedBufferGroup = DE_NULL;
	addChild((unsizedGroup		= new tcu::TestCaseGroup(m_testCtx,	"unsized",	"Unsized formats")));
	addChild((sizedGroup		= new tcu::TestCaseGroup(m_testCtx,	"sized",	"Sized formats")));
	addChild((sizedBufferGroup	= new tcu::TestCaseGroup(m_testCtx,	"buffer",	"Sized formats (Buffer)")));

	tcu::TestCaseGroup*	sizedCubeArrayGroup	= DE_NULL;
	sizedGroup->addChild((sizedCubeArrayGroup = new tcu::TestCaseGroup(m_testCtx, "cube_array", "Sized formats (2D Array)")));

	struct
	{
		const char*	name;
		deUint32	format;
		deUint32	dataType;
	} texFormats[] =
	{
		{ "alpha",							GL_ALPHA,			GL_UNSIGNED_BYTE },
		{ "luminance",						GL_LUMINANCE,		GL_UNSIGNED_BYTE },
		{ "luminance_alpha",				GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE },
		{ "rgb_unsigned_short_5_6_5",		GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgb_unsigned_byte",				GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba_unsigned_short_4_4_4_4",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "rgba_unsigned_short_5_5_5_1",	GL_RGBA,			GL_UNSIGNED_SHORT_5_5_5_1 },
		{ "rgba_unsigned_byte",				GL_RGBA,			GL_UNSIGNED_BYTE }
	};

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
	{
		deUint32	format		= texFormats[formatNdx].format;
		deUint32	dataType	= texFormats[formatNdx].dataType;
		string	nameBase		= texFormats[formatNdx].name;
		string	descriptionBase	= string(glu::getTextureFormatName(format)) + ", " + glu::getTypeName(dataType);

		unsizedGroup->addChild(new TextureCubeArrayFormatCase (m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), (nameBase + "_cube_array_pot").c_str(),		(descriptionBase + ", GL_TEXTURE_CUBE_MAP_ARRAY").c_str(), format, dataType, 64, 12));
		unsizedGroup->addChild(new TextureCubeArrayFormatCase (m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), (nameBase + "_cube_array_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_CUBE_MAP_ARRAY").c_str(), format, dataType, 64, 12));
	}

	struct
	{
		const char*	name;
		deUint32	internalFormat;
	} sizedColorFormats[] =
	{
		{ "rgba32f",			GL_RGBA32F,			},
		{ "rgba32i",			GL_RGBA32I,			},
		{ "rgba32ui",			GL_RGBA32UI,		},
		{ "rgba16f",			GL_RGBA16F,			},
		{ "rgba16i",			GL_RGBA16I,			},
		{ "rgba16ui",			GL_RGBA16UI,		},
		{ "rgba8",				GL_RGBA8,			},
		{ "rgba8i",				GL_RGBA8I,			},
		{ "rgba8ui",			GL_RGBA8UI,			},
		{ "srgb8_alpha8",		GL_SRGB8_ALPHA8,	},
		{ "rgb10_a2",			GL_RGB10_A2,		},
		{ "rgb10_a2ui",			GL_RGB10_A2UI,		},
		{ "rgba4",				GL_RGBA4,			},
		{ "rgb5_a1",			GL_RGB5_A1,			},
		{ "rgba8_snorm",		GL_RGBA8_SNORM,		},
		{ "rgb8",				GL_RGB8,			},
		{ "rgb565",				GL_RGB565,			},
		{ "r11f_g11f_b10f",		GL_R11F_G11F_B10F,	},
		{ "rgb32f",				GL_RGB32F,			},
		{ "rgb32i",				GL_RGB32I,			},
		{ "rgb32ui",			GL_RGB32UI,			},
		{ "rgb16f",				GL_RGB16F,			},
		{ "rgb16i",				GL_RGB16I,			},
		{ "rgb16ui",			GL_RGB16UI,			},
		{ "rgb8_snorm",			GL_RGB8_SNORM,		},
		{ "rgb8i",				GL_RGB8I,			},
		{ "rgb8ui",				GL_RGB8UI,			},
		{ "srgb8",				GL_SRGB8,			},
		{ "rgb9_e5",			GL_RGB9_E5,			},
		{ "rg32f",				GL_RG32F,			},
		{ "rg32i",				GL_RG32I,			},
		{ "rg32ui",				GL_RG32UI,			},
		{ "rg16f",				GL_RG16F,			},
		{ "rg16i",				GL_RG16I,			},
		{ "rg16ui",				GL_RG16UI,			},
		{ "rg8",				GL_RG8,				},
		{ "rg8i",				GL_RG8I,			},
		{ "rg8ui",				GL_RG8UI,			},
		{ "rg8_snorm",			GL_RG8_SNORM,		},
		{ "r32f",				GL_R32F,			},
		{ "r32i",				GL_R32I,			},
		{ "r32ui",				GL_R32UI,			},
		{ "r16f",				GL_R16F,			},
		{ "r16i",				GL_R16I,			},
		{ "r16ui",				GL_R16UI,			},
		{ "r8",					GL_R8,				},
		{ "r8i",				GL_R8I,				},
		{ "r8ui",				GL_R8UI,			},
		{ "r8_snorm",			GL_R8_SNORM,		}
	};

	struct
	{
		const char*	name;
		deUint32	internalFormat;
	} sizedDepthStencilFormats[] =
	{
		// Depth and stencil formats
		{ "depth_component32f",	GL_DEPTH_COMPONENT32F	},
		{ "depth_component24",	GL_DEPTH_COMPONENT24	},
		{ "depth_component16",	GL_DEPTH_COMPONENT16	},
		{ "depth32f_stencil8",	GL_DEPTH32F_STENCIL8	},
		{ "depth24_stencil8",	GL_DEPTH24_STENCIL8		}
	};

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(sizedColorFormats); formatNdx++)
	{
		deUint32	internalFormat	= sizedColorFormats[formatNdx].internalFormat;
		string		nameBase		= sizedColorFormats[formatNdx].name;
		string		descriptionBase	= glu::getTextureFormatName(internalFormat);

		sizedCubeArrayGroup->addChild(new TextureCubeArrayFormatCase (m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), (nameBase + "_pot").c_str(),		(descriptionBase + ", GL_TEXTURE_CUBE_MAP_ARRAY").c_str(), internalFormat, 64, 12));
		sizedCubeArrayGroup->addChild(new TextureCubeArrayFormatCase (m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), (nameBase + "_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_CUBE_MAP_ARRAY").c_str(), internalFormat, 64, 12));
	}

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(sizedDepthStencilFormats); formatNdx++)
	{
		deUint32	internalFormat	= sizedDepthStencilFormats[formatNdx].internalFormat;
		string		nameBase		= sizedDepthStencilFormats[formatNdx].name;
		string		descriptionBase	= glu::getTextureFormatName(internalFormat);

		sizedCubeArrayGroup->addChild(new TextureCubeArrayFormatCase (m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), (nameBase + "_pot").c_str(),		(descriptionBase + ", GL_TEXTURE_CUBE_MAP_ARRAY").c_str(), internalFormat, 64, 12));
		sizedCubeArrayGroup->addChild(new TextureCubeArrayFormatCase (m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), (nameBase + "_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_CUBE_MAP_ARRAY").c_str(), internalFormat, 64, 12));
	}

	// \todo Check
	struct
	{
		const char*	name;
		deUint32	internalFormat;
	} bufferColorFormats[] =
	{
		{ "r8",					GL_R8,				},
		{ "r16f",				GL_R16F,			},
		{ "r32f",				GL_R32F,			},
		{ "r8i",				GL_R8I,				},
		{ "r16i",				GL_R16I,			},
		{ "r32i",				GL_R32I,			},
		{ "r8ui",				GL_R8UI,			},
		{ "r16ui",				GL_R16UI,			},
		{ "r32ui",				GL_R32UI,			},
		{ "rg8",				GL_RG8,				},
		{ "rg16f",				GL_RG16F,			},
		{ "rg32f",				GL_RG32F,			},
		{ "rg8i",				GL_RG8I,			},
		{ "rg16i",				GL_RG16I,			},
		{ "rg32i",				GL_RG32I,			},
		{ "rg8ui",				GL_RG8UI,			},
		{ "rg16ui",				GL_RG16UI,			},
		{ "rg32ui",				GL_RG32UI,			},
		{ "rgba8",				GL_RGBA8,			},
		{ "rgba16f",			GL_RGBA16F,			},
		{ "rgba32f",			GL_RGBA32F,			},
		{ "rgba8i",				GL_RGBA8I,			},
		{ "rgba16i",			GL_RGBA16I,			},
		{ "rgba32i",			GL_RGBA32I,			},
		{ "rgba8ui",			GL_RGBA8UI,			},
		{ "rgba16ui",			GL_RGBA16UI,		},
		{ "rgba32ui",			GL_RGBA32UI,		}
	};

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(bufferColorFormats); formatNdx++)
	{
		deUint32	internalFormat	= bufferColorFormats[formatNdx].internalFormat;
		string		nameBase		= bufferColorFormats[formatNdx].name;
		string		descriptionBase	= glu::getTextureFormatName(internalFormat);

		sizedBufferGroup->addChild	(new TextureBufferFormatCase	(m_context, m_context.getRenderContext(),	(nameBase + "_pot").c_str(),	(descriptionBase + ", GL_TEXTURE_BUFFER").c_str(),	internalFormat, 64));
		sizedBufferGroup->addChild	(new TextureBufferFormatCase	(m_context, m_context.getRenderContext(),	(nameBase + "_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_BUFFER").c_str(),	internalFormat, 112));
	}
}